

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O2

void __thiscall
aggreports::OutputMeanDamageRatio
          (aggreports *this,int eptype,int eptype_tvar,offset_in_OutLosses_to_subr GetOutLoss,
          vector<int,_std::allocator<int>_> *fileIDs)

{
  bool bVar1;
  int eptype_00;
  vector<int,_std::allocator<int>_> *in_R9;
  
  bVar1 = this->ordFlag_;
  eptype_00 = (bVar1 ^ 1) + (uint)bVar1;
  if ((this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    MeanDamageRatioWithWeighting(this,in_R9,GetOutLoss,(int)fileIDs,eptype_00,eptype * (uint)bVar1);
    return;
  }
  MeanDamageRatio(this,in_R9,GetOutLoss,(int)fileIDs,eptype_00,eptype * (uint)bVar1);
  return;
}

Assistant:

void aggreports::OutputMeanDamageRatio(int eptype, const int eptype_tvar,
				       OASIS_FLOAT (OutLosses::*GetOutLoss)(),
				       const std::vector<int> &fileIDs) {

  // EPCalc = MEANDR for ORD output
  // EPCalc = 1 for legacy output
  int epcalc = ordFlag_ * MEANDR + !ordFlag_;
  // EPType doubles as ensemble ID for legacy output
  eptype *= ordFlag_;   // Set to default value 0 in legacy output

  if (periodstoweighting_.size() == 0) {
    MeanDamageRatio(fileIDs, GetOutLoss, epcalc, eptype, eptype_tvar);
    return;
  }

  MeanDamageRatioWithWeighting(fileIDs, GetOutLoss, epcalc, eptype,
			       eptype_tvar);

}